

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

_Bool telnet_ldisc(Backend *be,int option)

{
  Telnet *telnet;
  int option_local;
  Backend *be_local;
  
  if (option == 1) {
    be_local._7_1_ = (_Bool)(*(byte *)&be[-4].vt & 1);
  }
  else if (option == 0) {
    be_local._7_1_ = (_Bool)(*(byte *)((long)&be[-4].vt + 1) & 1);
  }
  else {
    be_local._7_1_ = false;
  }
  return be_local._7_1_;
}

Assistant:

static bool telnet_ldisc(Backend *be, int option)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    if (option == LD_ECHO)
        return telnet->echoing;
    if (option == LD_EDIT)
        return telnet->editing;
    return false;
}